

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O1

int64_t primecount::pi_lmo4(int64_t x)

{
  int iVar1;
  double dVar2;
  undefined1 x_00 [16];
  bool *pbVar3;
  bool *pbVar4;
  bool bVar5;
  ulong uVar6;
  int64_t iVar7;
  ulong uVar8;
  long res;
  ulong uVar9;
  long lVar10;
  long lVar11;
  size_t n;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  type primes;
  BinaryIndexedTree tree;
  Vector<bool,_std::allocator<bool>_> sieve;
  Vector<long,_std::allocator<long>_> next;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  double dVar18;
  Vector<int,_std::allocator<int>_> local_178;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  Vector<int,_std::allocator<int>_> local_148;
  ulong uStack_130;
  Vector<long,_std::allocator<long>_> local_128;
  Vector<bool,_std::allocator<bool>_> local_108;
  long local_f0;
  long local_e8;
  long *local_e0;
  ulong local_d8;
  int64_t local_d0;
  Vector<long,_std::allocator<long>_> local_c8;
  ulong local_b0;
  int64_t local_a8;
  size_t local_a0;
  ulong local_98;
  long *local_90;
  int *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  int *local_68;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<int,_std::allocator<int>_> local_48;
  
  if (x < 2) {
    iVar7 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffe80;
    x_00._0_8_ = in_stack_fffffffffffffe78;
    dVar18 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar2 = cbrt((double)x);
    uVar9 = (ulong)dVar2;
    if (0 < (long)uVar9) {
      do {
        if (uVar9 * uVar9 - (ulong)x / uVar9 == 0 ||
            (long)(uVar9 * uVar9) < (long)((ulong)x / uVar9)) goto LAB_0011b6df;
        bVar5 = 1 < (long)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar5);
      uVar9 = 0;
    }
LAB_0011b6df:
    lVar10 = uVar9 - 1;
    do {
      lVar11 = lVar10 + 2;
      lVar10 = lVar10 + 1;
    } while (lVar11 * lVar11 - x / lVar11 == 0 || lVar11 * lVar11 < x / lVar11);
    uVar9 = (ulong)(dVar18 * (double)lVar10);
    local_158 = 8;
    if (uVar9 < 0x14) {
      local_158 = (ulong)(byte)(&PhiTiny::pi)[uVar9];
    }
    generate_primes_i32(&local_178,uVar9);
    generate_lpf(&local_48,uVar9);
    generate_moebius(&local_60,uVar9);
    lVar10 = (long)local_178.end_ - (long)local_178.array_;
    bVar5 = is_print();
    lVar10 = (lVar10 >> 2) + -1;
    uVar6 = P2(x,uVar9,lVar10,1,bVar5);
    bVar5 = is_print();
    iVar7 = S1(x,uVar9,local_158,1,bVar5);
    local_160 = x / (long)uVar9;
    dVar18 = (double)(long)local_160;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    uVar14 = 0xb504f333;
    if ((long)dVar18 < 0xb504f333) {
      uVar14 = (long)dVar18;
    }
    if ((long)local_160 < (long)(uVar14 * uVar14)) {
      do {
        uVar14 = uVar14 - 1;
      } while (uVar14 * uVar14 - local_160 != 0 && (long)local_160 <= (long)(uVar14 * uVar14));
    }
    else {
      lVar11 = uVar14 * 2;
      if (lVar11 < (long)(local_160 - uVar14 * uVar14)) {
        do {
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 2;
        } while (lVar11 < (long)(local_160 - uVar14 * uVar14));
      }
    }
    lVar11 = 0x3f;
    if (uVar14 - 1 != 0) {
      for (; uVar14 - 1 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    n = 1L << (-((byte)lVar11 ^ 0x3f) & 0x3f);
    if (uVar14 < 2) {
      n = 1;
    }
    local_148.capacity_ = (int *)0x0;
    uStack_130 = 0;
    local_148.array_ = (int *)0x0;
    local_148.end_ = (int *)0x0;
    local_108.array_ = (bool *)0x0;
    local_108.end_ = (bool *)0x0;
    local_108.capacity_ = (bool *)0x0;
    Vector<bool,_std::allocator<bool>_>::resize(&local_108,n);
    local_c8.array_ = (long *)0x0;
    local_c8.end_ = (long *)0x0;
    local_c8.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_c8,(long)local_178.end_ - (long)local_178.array_ >> 2);
    local_128.array_ = (long *)0x0;
    local_128.end_ = (long *)0x0;
    local_128.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_128,(long)local_178.end_ - (long)local_178.array_ >> 2);
    lVar11 = (long)local_178.end_ - (long)local_178.array_ >> 2;
    if (0 < lVar11) {
      lVar11 = lVar11 + 1;
      lVar12 = 0;
      do {
        *(long *)((long)local_c8.array_ + lVar12 * 2) =
             (long)*(int *)((long)local_178.array_ + lVar12);
        lVar11 = lVar11 + -1;
        lVar12 = lVar12 + 4;
      } while (1 < lVar11);
    }
    if (local_128.array_ != local_128.end_) {
      memset(local_128.array_,0,(long)local_128.end_ - (long)local_128.array_ & 0xfffffffffffffff8);
    }
    local_b0 = uVar6;
    local_a8 = iVar7;
    if ((long)local_160 < 2) {
      lVar11 = 0;
    }
    else {
      local_98 = 1;
      local_f0 = -1;
      lVar11 = 0;
      local_150 = uVar9;
      local_e8 = lVar10;
      local_d0 = x;
      local_a0 = n;
      do {
        pbVar4 = local_108.end_;
        pbVar3 = local_108.array_;
        uVar6 = local_a0 + local_98;
        uVar9 = uVar6;
        if ((long)local_160 < (long)uVar6) {
          uVar9 = local_160;
        }
        local_d8 = local_98;
        if (local_108.array_ != local_108.end_) {
          local_98 = uVar6;
          memset(local_108.array_,1,(long)local_108.end_ - (long)local_108.array_);
          uVar6 = local_98;
        }
        local_98 = uVar6;
        if (local_158 != 0) {
          uVar6 = 1;
          do {
            lVar10 = local_c8.array_[uVar6];
            if (lVar10 < (long)uVar9) {
              iVar1 = local_178.array_[uVar6];
              do {
                pbVar3[lVar10 + local_f0] = false;
                lVar10 = lVar10 + iVar1;
              } while (lVar10 < (long)uVar9);
            }
            local_c8.array_[uVar6] = lVar10;
            bVar5 = uVar6 != local_158;
            uVar6 = uVar6 + 1;
          } while (bVar5);
        }
        uStack_130 = (ulong)((long)pbVar4 - (long)pbVar3) >> 1;
        Vector<int,_std::allocator<int>_>::resize(&local_148,uStack_130);
        if (0 < (long)uStack_130) {
          uVar6 = 0;
          do {
            uVar15 = (uint)local_108.array_[uVar6 * 2];
            local_148.array_[uVar6] = (uint)local_108.array_[uVar6 * 2];
            uVar13 = uVar6 + 1;
            uVar16 = ~uVar6 & uVar13;
            uVar14 = uVar6;
            if (1 < uVar16) {
              do {
                uVar15 = uVar15 + local_148.array_[uVar14 - 1];
                local_148.array_[uVar6] = uVar15;
                bVar5 = 3 < uVar16;
                uVar14 = uVar14 & uVar14 - 1;
                uVar16 = uVar16 >> 1;
              } while (bVar5);
            }
            uVar6 = uVar13;
          } while (uVar13 != uStack_130);
        }
        local_68 = local_178.array_;
        local_78 = (long)(~local_d8 + uVar9) >> 1;
        local_88 = local_148.array_;
        local_80 = local_78 + 1 & local_78;
        local_90 = local_128.array_;
        local_e0 = local_c8.array_;
        uVar6 = local_158;
        do {
          uVar6 = uVar6 + 1;
          if (local_e8 <= (long)uVar6) break;
          lVar17 = (long)local_178.array_[uVar6];
          lVar12 = x / (long)(uVar9 * lVar17);
          lVar10 = (long)local_150 / lVar17;
          if ((long)local_150 / lVar17 < lVar12) {
            lVar10 = lVar12;
          }
          uVar14 = x / (long)(local_d8 * lVar17);
          if ((long)local_150 <= (long)uVar14) {
            uVar14 = local_150;
          }
          uVar16 = uVar14;
          if (lVar17 < (long)uVar14) {
            for (; lVar10 < (long)uVar16; uVar16 = uVar16 - 1) {
              if (((long)local_60.array_[uVar16] != 0) &&
                 (local_178.array_[uVar6] < local_48.array_[uVar16])) {
                uVar8 = (long)(local_d0 / (long)(uVar16 * lVar17) - local_d8) >> 1;
                uVar13 = uVar8 + 1;
                lVar12 = (long)local_148.array_[uVar8];
                while (uVar13 = uVar13 & uVar8, uVar13 != 0) {
                  lVar12 = lVar12 + local_148.array_[uVar13 - 1];
                  uVar8 = uVar13 - 1;
                }
                lVar11 = lVar11 - (lVar12 + local_128.array_[uVar6]) * (long)local_60.array_[uVar16]
                ;
              }
            }
            lVar10 = (long)local_148.array_[local_78];
            for (uVar16 = local_80; uVar16 != 0; uVar16 = uVar16 & uVar16 - 1) {
              lVar10 = lVar10 + local_148.array_[uVar16 - 1];
            }
            local_128.array_[uVar6] = local_128.array_[uVar6] + lVar10;
            lVar10 = local_c8.array_[uVar6];
            if (lVar10 < (long)uVar9) {
              do {
                lVar12 = lVar10 - local_d8;
                if (local_108.array_[lVar12] == true) {
                  local_108.array_[lVar12] = false;
                  uVar16 = lVar12 >> 1;
                  do {
                    local_148.array_[uVar16] = local_148.array_[uVar16] + -1;
                    uVar16 = uVar16 | uVar16 + 1;
                  } while ((long)uVar16 < (long)uStack_130);
                }
                lVar10 = lVar10 + lVar17 * 2;
              } while (lVar10 < (long)uVar9);
            }
            local_c8.array_[uVar6] = lVar10;
            x = local_d0;
            local_70 = uVar14;
          }
        } while (lVar17 < (long)uVar14);
        local_f0 = local_f0 - local_a0;
        lVar10 = local_e8;
      } while ((long)local_98 < (long)local_160);
    }
    operator_delete(local_128.array_,(long)local_128.capacity_ - (long)local_128.array_);
    operator_delete(local_c8.array_,(long)local_c8.capacity_ - (long)local_c8.array_);
    operator_delete(local_108.array_,(long)local_108.capacity_ - (long)local_108.array_);
    operator_delete(local_148.array_,(long)local_148.capacity_ - (long)local_148.array_);
    iVar7 = local_a8 + lVar11 + lVar10 + ~local_b0;
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_48.array_,(long)local_48.capacity_ - (long)local_48.array_);
    operator_delete(local_178.array_,(long)local_178.capacity_ - (long)local_178.array_);
  }
  return iVar7;
}

Assistant:

int64_t pi_lmo4(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}